

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O1

void addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
               (NeuralNetwork *nn,int64_t defaultValue,int64_t minValue,int64_t maxValue,
               set<long,_std::less<long>,_std::allocator<long>_> *allowedValues)

{
  int iVar1;
  long lVar2;
  NetworkUpdateParameters *pNVar3;
  BoolParameter *this;
  Int64Parameter *pIVar4;
  Int64Set *pIVar5;
  _Base_ptr p_Var6;
  Int64Range *pIVar7;
  _Rb_tree_header *p_Var8;
  
  if (nn->updateparams_ == (NetworkUpdateParameters *)0x0) {
    pNVar3 = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(pNVar3);
    nn->updateparams_ = pNVar3;
  }
  pNVar3 = nn->updateparams_;
  if (pNVar3->shuffle_ == (BoolParameter *)0x0) {
    this = (BoolParameter *)operator_new(0x18);
    CoreML::Specification::BoolParameter::BoolParameter(this);
    pNVar3->shuffle_ = this;
  }
  pNVar3->shuffle_->defaultvalue_ = true;
  if (pNVar3->seed_ == (Int64Parameter *)0x0) {
    pIVar4 = (Int64Parameter *)operator_new(0x28);
    CoreML::Specification::Int64Parameter::Int64Parameter(pIVar4);
    pNVar3->seed_ = pIVar4;
  }
  pIVar4 = pNVar3->seed_;
  pIVar4->defaultvalue_ = defaultValue;
  if ((allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (pIVar4->_oneof_case_[0] != 10) {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar4);
      pIVar4->_oneof_case_[0] = 10;
      pIVar7 = (Int64Range *)operator_new(0x28);
      CoreML::Specification::Int64Range::Int64Range(pIVar7);
      (pIVar4->AllowedValues_).range_ = pIVar7;
    }
    pIVar7 = (pIVar4->AllowedValues_).range_;
    pIVar7->minvalue_ = minValue;
    pIVar7->maxvalue_ = maxValue;
  }
  else {
    if (pIVar4->_oneof_case_[0] != 0xb) {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar4);
      pIVar4->_oneof_case_[0] = 0xb;
      pIVar5 = (Int64Set *)operator_new(0x28);
      CoreML::Specification::Int64Set::Int64Set(pIVar5);
      (pIVar4->AllowedValues_).set_ = pIVar5;
    }
    p_Var6 = (allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(allowedValues->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var8) {
      pIVar5 = (pIVar4->AllowedValues_).set_;
      do {
        lVar2 = *(long *)(p_Var6 + 1);
        iVar1 = (pIVar5->values_).total_size_;
        if ((pIVar5->values_).current_size_ == iVar1) {
          google::protobuf::RepeatedField<long>::Reserve(&pIVar5->values_,iVar1 + 1);
        }
        iVar1 = (pIVar5->values_).current_size_;
        (pIVar5->values_).current_size_ = iVar1 + 1;
        ((pIVar5->values_).rep_)->elements[iVar1] = lVar2;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var8);
    }
  }
  return;
}

Assistant:

void addShuffleAndSeed(NeuralNetworkClass *nn, int64_t defaultValue, int64_t minValue,  int64_t maxValue, std::set<int64_t> allowedValues) {
    auto updateParameters = nn->mutable_updateparams();
    auto shuffle = updateParameters->mutable_shuffle();
    shuffle->set_defaultvalue(true);

    auto shuffleSeed = updateParameters->mutable_seed();
    shuffleSeed->set_defaultvalue(defaultValue);

    if (allowedValues.size() == 0) {
        auto int64Range = shuffleSeed->mutable_range();
        int64Range->set_minvalue(minValue);
        int64Range->set_maxvalue(maxValue);
    }
    else {
        auto int64Set = shuffleSeed->mutable_set();
        for (auto& x : allowedValues) {
            int64Set->add_values(x);
        }
    }
}